

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

void GPU_SetImageVirtualResolution(GPU_Image *image,Uint16 w,Uint16 h)

{
  Uint16 h_local;
  Uint16 w_local;
  GPU_Image *image_local;
  
  if ((((_gpu_current_renderer != (GPU_Renderer *)0x0) &&
       (_gpu_current_renderer->current_context_target != (GPU_Target *)0x0)) && (w != 0)) &&
     ((h != 0 && (image != (GPU_Image *)0x0)))) {
    GPU_FlushBlitBuffer();
    image->w = w;
    image->h = h;
    image->using_virtual_resolution = true;
  }
  return;
}

Assistant:

void GPU_SetImageVirtualResolution(GPU_Image* image, Uint16 w, Uint16 h)
{
    if(_gpu_current_renderer == NULL || _gpu_current_renderer->current_context_target == NULL || w == 0 || h == 0)
        return;

    if(image == NULL)
        return;

    GPU_FlushBlitBuffer();  // TODO: Perhaps move SetImageVirtualResolution into the renderer so we can check to see if this image is bound first.
    image->w = w;
    image->h = h;
    image->using_virtual_resolution = 1;
}